

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.cpp
# Opt level: O0

shared_ptr<Quad> __thiscall Quad::firstQuad(Quad *this)

{
  double *in_RSI;
  shared_ptr<Quad> sVar1;
  double local_28;
  double local_20 [2];
  Quad *this_local;
  
  local_20[0] = *in_RSI + in_RSI[2] / 4.0;
  local_28 = in_RSI[1] + in_RSI[2] / 4.0;
  this_local = this;
  sVar1 = std::make_shared<Quad,double,double,double>(&this->xMid,local_20,&local_28);
  sVar1.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Quad>)sVar1.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Quad> Quad::firstQuad() {
    return std::make_shared<Quad>(this->xMid + this->length / 4.0, this->yMid + this->length / 4.0, this->length / 2.0);
}